

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlChar * xmlBufDetach(xmlBufPtr buf)

{
  xmlBufPtr local_20;
  xmlChar *ret;
  xmlBufPtr buf_local;
  
  if (((buf == (xmlBufPtr)0x0) || ((buf->flags & 3) != 0)) || ((buf->flags & 4) != 0)) {
    buf_local = (xmlBufPtr)0x0;
  }
  else {
    if (buf->content == buf->mem) {
      local_20 = (xmlBufPtr)buf->mem;
    }
    else {
      local_20 = (xmlBufPtr)xmlStrndup(buf->content,(int)buf->use);
      (*xmlFree)(buf->mem);
    }
    buf->content = (xmlChar *)0x0;
    buf->mem = (xmlChar *)0x0;
    buf->size = 0;
    buf->use = 0;
    if (buf->size < 0x7fffffff) {
      buf->compat_size = (uint)buf->size;
    }
    else {
      buf->compat_size = 0x7fffffff;
    }
    if (buf->use < 0x7fffffff) {
      buf->compat_use = (uint)buf->use;
    }
    else {
      buf->compat_use = 0x7fffffff;
    }
    buf_local = local_20;
  }
  return (xmlChar *)buf_local;
}

Assistant:

xmlChar *
xmlBufDetach(xmlBufPtr buf) {
    xmlChar *ret;

    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(NULL);

    if (buf->content != buf->mem) {
        ret = xmlStrndup(buf->content, buf->use);
        xmlFree(buf->mem);
    } else {
        ret = buf->mem;
    }

    buf->content = NULL;
    buf->mem = NULL;
    buf->size = 0;
    buf->use = 0;

    UPDATE_COMPAT(buf);
    return ret;
}